

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte *pbVar1;
  int iVar2;
  ostream *poVar3;
  string buffer;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_4f8;
  path input_name;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_4c8;
  push_parser<printing_callbacks> parser;
  ifstream input;
  reader reader;
  
  if (argc == 2) {
    boost::filesystem::path::path(&input_name,argv[1]);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              (&input,&input_name);
    if (((&input.super_basic_ifstream<char,_std::char_traits<char>_>.
           super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
         [(long)input.super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 5) ==
        0) {
      pbVar1 = &input.super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>.field_0x19 +
               (long)input.super_basic_ifstream<char,_std::char_traits<char>_>.
                     super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3];
      *pbVar1 = *pbVar1 & 0xef;
      std::istream_iterator<char,_char,_std::char_traits<char>,_long>::istream_iterator
                (&local_4f8,(istream_type *)&input);
      local_4c8._M_stream = (istream_type *)0x0;
      local_4c8._M_value = '\0';
      local_4c8._M_ok = false;
      std::__cxx11::string::
      string<std::istream_iterator<char,char,std::char_traits<char>,long>,void>
                ((string *)&buffer,&local_4f8,&local_4c8,(allocator<char> *)&parser);
      parser.reader.decoder.input.head = (const_pointer)buffer._M_string_length;
      parser.reader.decoder.input.tail = buffer._M_dataplus._M_p;
      trial::protocol::json::basic_reader<char>::basic_reader(&reader,(view_type *)&parser);
      trial::protocol::json::basic_reader<char>::basic_reader(&parser.reader,&reader);
      example::push_parser<printing_callbacks>::parse(&parser);
      std::
      _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                       *)&parser.reader.stack);
      std::
      _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                       *)&reader.stack);
      std::__cxx11::string::~string((string *)&buffer);
    }
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream(&input);
    std::__cxx11::string::~string((string *)&input_name);
    iVar2 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," <file>");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    try
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
            return 1;
        }

        boost::filesystem::path input_name(argv[1]);
        boost::filesystem::ifstream input(input_name);
        if (input)
        {
            std::noskipws(input);
            std::string buffer((std::istream_iterator<char>(input)),
                               (std::istream_iterator<char>()));

            json::reader reader(buffer);
            example::push_parser<printing_callbacks> parser(reader);
            parser.parse();
        }
    }
    catch (const std::exception& ex)
    {
        std::cout << "Error: " << ex.what() << std::endl;
    }
    return 0;
}